

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>> *this,
          size_t size,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::int_writer<int,_fmt::v5::basic_format_specs<wchar_t>_>::dec_writer>
          f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  wchar_t __tmp;
  ulong uVar6;
  wchar_t *pwVar7;
  wchar_t *local_40;
  ulong local_38;
  
  uVar5 = (ulong)spec->width_;
  uVar3 = uVar5 - size;
  if (uVar5 < size || uVar3 == 0) {
    puVar2 = *(undefined8 **)this;
    lVar4 = puVar2[2];
    uVar3 = size + lVar4;
    if ((ulong)puVar2[3] < uVar3) {
      (**(code **)*puVar2)(puVar2,uVar3);
    }
    puVar2[2] = uVar3;
    local_40 = (wchar_t *)(lVar4 * 4 + puVar2[1]);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                  *)&f,&local_40);
  }
  else {
    puVar2 = *(undefined8 **)this;
    lVar4 = puVar2[2];
    uVar6 = lVar4 + uVar5;
    if ((ulong)puVar2[3] < uVar6) {
      local_38 = uVar3;
      (**(code **)*puVar2)(puVar2,uVar6);
      uVar3 = local_38;
    }
    puVar2[2] = uVar6;
    pwVar7 = (wchar_t *)(lVar4 * 4 + puVar2[1]);
    wVar1 = spec->fill_;
    local_40 = pwVar7;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = uVar3 >> 1;
      if (1 < uVar3) {
        local_40 = pwVar7 + uVar6;
        lVar4 = 0;
        do {
          *(wchar_t *)((long)pwVar7 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar6 * 4 - lVar4 != 0);
      }
      local_38 = uVar3;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
      if (uVar5 != size) {
        lVar4 = 0;
        do {
          *(wchar_t *)((long)local_40 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar5 * 4 + size * -4 + uVar6 * -4 != lVar4);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar5 != size) {
        local_40 = pwVar7 + uVar3;
        lVar4 = 0;
        do {
          *(wchar_t *)((long)pwVar7 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar5 * 4 + size * -4 != lVar4);
      }
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
    }
    else {
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<int,fmt::v5::basic_format_specs<wchar_t>>::dec_writer>
                    *)&f,&local_40);
      if (uVar5 != size) {
        lVar4 = 0;
        do {
          *(wchar_t *)((long)local_40 + lVar4) = wVar1;
          lVar4 = lVar4 + 4;
        } while (uVar5 * 4 + size * -4 != lVar4);
      }
    }
  }
  return;
}

Assistant:

void basic_writer<Range>::write_padded(
    std::size_t size, const align_spec &spec, F f) {
  unsigned width = spec.width();
  if (width <= size)
    return f(reserve(size));
  auto &&it = reserve(width);
  char_type fill = static_cast<char_type>(spec.fill());
  std::size_t padding = width - size;
  if (spec.align() == ALIGN_RIGHT) {
    it = std::fill_n(it, padding, fill);
    f(it);
  } else if (spec.align() == ALIGN_CENTER) {
    std::size_t left_padding = padding / 2;
    it = std::fill_n(it, left_padding, fill);
    f(it);
    it = std::fill_n(it, padding - left_padding, fill);
  } else {
    f(it);
    it = std::fill_n(it, padding, fill);
  }
}